

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O3

QString * QSysInfo::kernelType(void)

{
  int iVar1;
  char *pcVar2;
  storage_type *in_RCX;
  char *pcVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView ba;
  utsname u;
  QString local_1c0;
  utsname local_1a6;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_1a6,0xaa,0x186);
  iVar1 = uname(&local_1a6);
  if (iVar1 == 0) {
    pcVar2 = (char *)memchr(&local_1a6,0,0x41);
    pcVar3 = local_1a6.nodename;
    if (pcVar2 != (char *)0x0) {
      pcVar3 = pcVar2;
    }
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)&local_1a6;
    QString::fromLatin1(&local_1c0,(QString *)(pcVar3 + -(long)&local_1a6),ba);
    QString::toLower_helper(in_RDI,&local_1c0);
    if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = L"unknown";
    (in_RDI->d).size = 7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::kernelType()
{
#if defined(Q_OS_WIN)
    return QStringLiteral("winnt");
#elif defined(Q_OS_UNIX)
    struct utsname u;
    if (uname(&u) == 0)
        return QString::fromLatin1(u.sysname).toLower();
#endif
    return unknownText();
}